

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  uint uVar7;
  int iVar8;
  undefined7 in_register_00000009;
  byte *pbVar9;
  i64 iVar10;
  byte *pbVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  long lVar15;
  bool bVar16;
  
  uVar7 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar7 == 1) {
    lVar13 = 1;
    bVar14 = 0;
    pbVar9 = (byte *)zNum;
  }
  else {
    uVar12 = (ulong)(3 - uVar7);
    if ((int)(3 - uVar7) < (int)(length & 0xfffffffeU)) {
      uVar12 = (ulong)(int)(3 - uVar7);
      do {
        if (zNum[uVar12] != '\0') {
          bVar14 = 1;
          goto LAB_00144691;
        }
        uVar12 = uVar12 + 2;
      } while ((long)uVar12 < (long)(int)(length & 0xfffffffeU));
    }
    bVar14 = 0;
LAB_00144691:
    length = (uint)uVar12 ^ 1;
    pbVar9 = (byte *)(zNum + (uVar7 & 1));
    lVar13 = 2;
  }
  pbVar11 = (byte *)(zNum + length);
  bVar3 = true;
  for (; pbVar6 = pbVar9, pbVar9 < pbVar11; pbVar9 = pbVar9 + lVar13) {
    bVar1 = *pbVar9;
    if ((""[bVar1] & 1) == 0) {
      if (bVar1 == 0x2b) {
        pbVar9 = pbVar9 + lVar13;
        pbVar6 = pbVar9;
      }
      else if (bVar1 == 0x2d) {
        pbVar9 = pbVar9 + lVar13;
        bVar3 = false;
        pbVar6 = pbVar9;
      }
      break;
    }
  }
  for (; (pbVar9 < pbVar11 && (*pbVar9 == 0x30)); pbVar9 = pbVar9 + lVar13) {
  }
  if (pbVar9 < pbVar11) {
    lVar15 = 0;
    lVar5 = 0;
    do {
      bVar16 = (byte)(pbVar9[lVar15] - 0x30) < 10;
      if (!bVar16) break;
      lVar5 = (ulong)pbVar9[lVar15] + lVar5 * 10 + -0x30;
      lVar15 = lVar15 + lVar13;
    } while (pbVar9 + lVar15 < pbVar11);
    uVar7 = (uint)lVar15;
    if (lVar5 < 0) {
      lVar5 = 0x7fffffffffffffff;
      lVar15 = -0x8000000000000000;
      goto LAB_00144758;
    }
  }
  else {
    uVar7 = 0;
    bVar16 = true;
    lVar5 = 0;
  }
  lVar15 = -lVar5;
LAB_00144758:
  if (bVar3) {
    lVar15 = lVar5;
  }
  *pNum = lVar15;
  if ((uVar7 != 0) || (uVar4 = 0xffffffff, pbVar6 != pbVar9)) {
    if (bVar16 || bVar14 != 0) {
      uVar4 = (uint)bVar14;
    }
    else {
      pbVar6 = pbVar9 + uVar7;
      do {
        if ((""[*pbVar6] & 1) == 0) {
          uVar4 = 1;
          goto LAB_001447a6;
        }
        pbVar6 = pbVar6 + lVar13;
      } while (pbVar6 < pbVar11);
      uVar4 = 0;
    }
  }
LAB_001447a6:
  uVar2 = (int)lVar13 * 0x13;
  if (uVar2 <= uVar7) {
    if (uVar2 < uVar7) {
      iVar10 = -0x8000000000000000;
      if (bVar3) {
        iVar10 = 0x7fffffffffffffff;
      }
      *pNum = iVar10;
      uVar4 = 2;
    }
    else {
      uVar12 = 0;
      pbVar11 = pbVar9;
      do {
        bVar14 = *pbVar11;
        bVar1 = "922337203685477580"[uVar12];
        if (0x10 < uVar12) break;
        uVar12 = uVar12 + 1;
        pbVar11 = pbVar11 + lVar13;
      } while (bVar14 == bVar1);
      if (bVar14 == bVar1) {
        iVar8 = (char)pbVar9[lVar13 * 0x12] + -0x38;
      }
      else {
        iVar8 = ((int)(char)bVar14 - (int)(char)bVar1) * 10;
      }
      if (-1 < iVar8) {
        iVar10 = -0x8000000000000000;
        if (bVar3) {
          iVar10 = 0x7fffffffffffffff;
        }
        *pNum = iVar10;
        if (bVar3) {
          uVar4 = 3;
        }
        if (iVar8 != 0) {
          uVar4 = 2;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appease the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( i==0 && zStart==zNum ){    /* No digits */
    rc = -1;
  }else if( nonNum ){            /* UTF16 with high-order bytes non-zero */
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}